

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

int BN_print_fp(FILE *fp,BIGNUM *a)

{
  int iVar1;
  BIO *a_00;
  
  a_00 = BIO_new_fp(fp,0);
  if (a_00 == (BIO *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = BN_print(a_00,a);
    BIO_free(a_00);
  }
  return iVar1;
}

Assistant:

int BN_print_fp(FILE *fp, const BIGNUM *a) {
  BIO *b = BIO_new_fp(fp, BIO_NOCLOSE);
  if (b == NULL) {
    return 0;
  }

  int ret = BN_print(b, a);
  BIO_free(b);
  return ret;
}